

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

int __thiscall HModel::get_nonbasicMove(HModel *this,int var)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[var];
  dVar2 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[var];
  if (dVar1 <= -1e+200) {
    return -(uint)(dVar2 < 1e+200);
  }
  if (dVar2 < 1e+200) {
    return -(uint)(dVar1 != dVar2) & 1;
  }
  return 1;
}

Assistant:

int HModel::get_nonbasicMove(int var) {
  //  printf("Calling get_nonbasicMove with var = %2d; numTot = %2d\n", var, numTot); cout<<flush;
  assert(var >= 0);
  assert(var < numTot);
  if (!hsol_isInfinity(-workLower[var])) {
    if (!hsol_isInfinity(workUpper[var])) {
      //Finite lower and upper bounds so nonbasic move depends on whether they are equal
      if (workLower[var] == workUpper[var])
	//Fixed variable so nonbasic move is zero
	return NONBASIC_MOVE_ZE;
	//Boxed variable so nonbasic move is up (from lower bound)
      return NONBASIC_MOVE_UP;}
    else
      //Finite lower bound and infinite upper bound so nonbasic move is up (from lower bound)
      return NONBASIC_MOVE_UP;}
  else
      //Infinite lower bound so nonbasic move depends on whether the upper bound is finite
    if (!hsol_isInfinity(workUpper[var]))
      //Finite upper bound so nonbasic move is down (from upper bound)
      return NONBASIC_MOVE_DN;
  //Infinite upper bound so free variable: nonbasic move is zero
  return NONBASIC_MOVE_ZE;
}